

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

SelectionVectorHelper * __thiscall
duckdb::ReservoirSample::GetReplacementIndexesSlow
          (SelectionVectorHelper *__return_storage_ptr__,ReservoirSample *this,
          idx_t sample_chunk_offset,idx_t chunk_length)

{
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_00;
  idx_t iVar1;
  SelectionVectorHelper *this_01;
  ReservoirSample *this_02;
  pointer pBVar2;
  mapped_type *pmVar3;
  pointer pBVar4;
  __node_base _Var5;
  mapped_type mVar6;
  sel_t *psVar7;
  ulong uVar8;
  pair<double,_unsigned_long> pVar9;
  SelectionVector ret_sel;
  SelectionVectorHelper *ret;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ret_map;
  SelectionVector local_b8;
  SelectionVectorHelper *local_a0;
  idx_t local_98;
  ReservoirSample *local_90;
  double local_88;
  SelectionVector local_80;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &(this->super_BlockingSample).base_reservoir_sample;
  psVar7 = (sel_t *)0x0;
  mVar6 = 0;
  local_a0 = __return_storage_ptr__;
  local_98 = sample_chunk_offset;
  local_90 = this;
  while( true ) {
    pBVar2 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    iVar1 = pBVar2->next_index_to_sample;
    pBVar2 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    uVar8 = iVar1 - pBVar2->num_entries_to_skip_b4_next_sample;
    if (chunk_length < uVar8 || chunk_length - uVar8 == 0) break;
    psVar7 = (sel_t *)((long)psVar7 + uVar8);
    local_b8.sel_vector = psVar7;
    pmVar3 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,(key_type *)&local_b8);
    *pmVar3 = mVar6;
    pBVar2 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    this_02 = local_90;
    pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    local_88 = RandomEngine::NextRandom32((RandomEngine *)pBVar2,pBVar4->min_weight_threshold,1.0);
    pVar9 = BlockingSample::PopFromWeightQueue(&this_02->super_BlockingSample);
    (this_02->sel).sel_vector[pVar9.second] = (int)local_98 + (int)mVar6;
    pBVar2 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    BaseReservoirSampling::ReplaceElementWithIndex(pBVar2,pVar9.second,local_88,false);
    mVar6 = mVar6 + 1;
    chunk_length = chunk_length - uVar8;
  }
  pBVar2 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  pBVar2->num_entries_to_skip_b4_next_sample =
       pBVar2->num_entries_to_skip_b4_next_sample + chunk_length;
  SelectionVector::SelectionVector(&local_b8,local_68._M_element_count);
  this_01 = local_a0;
  for (_Var5._M_nxt = local_68._M_before_begin._M_nxt; _Var5._M_nxt != (_Hash_node_base *)0x0;
      _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
    local_b8.sel_vector[(long)_Var5._M_nxt[2]._M_nxt] = *(sel_t *)&_Var5._M_nxt[1]._M_nxt;
  }
  (local_a0->sel).sel_vector = (sel_t *)0x0;
  (local_a0->sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (local_a0->sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  SelectionVector::SelectionVector(&local_80,&local_b8);
  SelectionVector::operator=(&this_01->sel,&local_80);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this_01->size = (uint32_t)local_68._M_element_count;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return this_01;
}

Assistant:

SelectionVectorHelper ReservoirSample::GetReplacementIndexesSlow(const idx_t sample_chunk_offset,
                                                                 const idx_t chunk_length) {
	idx_t remaining = chunk_length;
	std::unordered_map<idx_t, idx_t> ret_map;
	idx_t sample_chunk_index = 0;

	idx_t base_offset = 0;

	while (true) {
		idx_t offset =
		    base_reservoir_sample->next_index_to_sample - base_reservoir_sample->num_entries_to_skip_b4_next_sample;
		if (offset >= remaining) {
			// not in this chunk! increment current count and go to the next chunk
			base_reservoir_sample->num_entries_to_skip_b4_next_sample += remaining;
			break;
		}
		// in this chunk! replace the element
		// ret[index_in_new_chunk] = index_in_sample_chunk (the sample chunk offset will be applied later)
		// D_ASSERT(sample_chunk_index == ret.size());
		ret_map[base_offset + offset] = sample_chunk_index;
		double r2 = base_reservoir_sample->random.NextRandom32(base_reservoir_sample->min_weight_threshold, 1);
		// replace element in our max_heap
		// first get the top most pair
		const auto top = PopFromWeightQueue();
		const auto index = top.second;
		const auto index_in_sample_chunk = sample_chunk_offset + sample_chunk_index;
		sel.set_index(index, index_in_sample_chunk);
		base_reservoir_sample->ReplaceElementWithIndex(index, r2, false);

		sample_chunk_index += 1;
		// shift the chunk forward
		remaining -= offset;
		base_offset += offset;
	}

	// create selection vector to return
	SelectionVector ret_sel(ret_map.size());
	D_ASSERT(sel_size == sample_count);
	for (auto &kv : ret_map) {
		ret_sel.set_index(kv.second, kv.first);
	}
	SelectionVectorHelper ret;
	ret.sel = SelectionVector(ret_sel);
	ret.size = static_cast<uint32_t>(ret_map.size());
	return ret;
}